

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmPushFilePath(jx9_vm *pVm,char *zPath,int nLen,sxu8 bMain,sxi32 *pNew)

{
  int iVar1;
  sxi32 sVar2;
  char *pChunk;
  sxi32 rc;
  char *zDup;
  SyString sPath;
  sxi32 *pNew_local;
  sxu8 bMain_local;
  int nLen_local;
  char *zPath_local;
  jx9_vm *pVm_local;
  
  sPath._8_8_ = pNew;
  pNew_local._4_4_ = nLen;
  if (nLen < 0) {
    pNew_local._4_4_ = SyStrlen(zPath);
  }
  pChunk = SyMemBackendStrDup(&pVm->sAllocator,zPath,pNew_local._4_4_);
  if (pChunk == (char *)0x0) {
    pVm_local._4_4_ = -1;
  }
  else {
    sPath.zString._0_4_ = pNew_local._4_4_;
    zDup = pChunk;
    if (bMain == '\0') {
      iVar1 = VmIsIncludedFile(pVm,(SyString *)&zDup);
      if (iVar1 == 0) {
        sVar2 = SySetPut(&pVm->aIncluded,&zDup);
        if (sVar2 != 0) {
          SyMemBackendFree(&pVm->sAllocator,pChunk);
          return sVar2;
        }
        *(undefined4 *)sPath._8_8_ = 1;
      }
      else {
        *(undefined4 *)sPath._8_8_ = 0;
      }
    }
    SySetPut(&pVm->aFiles,&zDup);
    pVm_local._4_4_ = 0;
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmPushFilePath(jx9_vm *pVm, const char *zPath, int nLen, sxu8 bMain, sxi32 *pNew)
{
	SyString sPath;
	char *zDup;
#ifdef __WINNT__
	char *zCur;
#endif
	sxi32 rc;
	if( nLen < 0 ){
		nLen = SyStrlen(zPath);
	}
	/* Duplicate the file path first */
	zDup = SyMemBackendStrDup(&pVm->sAllocator, zPath, nLen);
	if( zDup == 0 ){
		return SXERR_MEM;
	}
#ifdef __WINNT__
	/* Normalize path on windows
	 * Example:
	 *    Path/To/File.jx9
	 * becomes
	 *   path\to\file.jx9
	 */
	zCur = zDup;
	while( zCur[0] != 0 ){
		if( zCur[0] == '/' ){
			zCur[0] = '\\';
		}else if( (unsigned char)zCur[0] < 0xc0 && SyisUpper(zCur[0]) ){
			int c = SyToLower(zCur[0]);
			zCur[0] = (char)c; /* MSVC stupidity */
		}
		zCur++;
	}
#endif
	/* Install the file path */
	SyStringInitFromBuf(&sPath, zDup, nLen);
	if( !bMain ){
		if( VmIsIncludedFile(&(*pVm), &sPath) ){
			/* Already included */
			*pNew = 0;
		}else{
			/* Insert in the corresponding container */
			rc = SySetPut(&pVm->aIncluded, (const void *)&sPath);
			if( rc != SXRET_OK ){
				SyMemBackendFree(&pVm->sAllocator, zDup);
				return rc;
			}
			*pNew = 1;
		}
	}
	SySetPut(&pVm->aFiles, (const void *)&sPath);
	return SXRET_OK;
}